

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreecheck(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  int errCode;
  char *pcVar1;
  char *zTab;
  char *pcVar2;
  long in_FS_OFFSET;
  char *zReport;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (nArg - 3U < 0xfffffffe) {
    ctx->isError = 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      sqlite3VdbeMemSetStr
                (ctx->pOut,"wrong number of arguments to function rtreecheck()",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
  }
  else {
    local_30 = (char *)0x0;
    pcVar1 = (char *)sqlite3ValueText(*apArg,'\x01');
    if (nArg == 1) {
      pcVar2 = "main";
      zTab = pcVar1;
    }
    else {
      zTab = (char *)sqlite3ValueText(apArg[1],'\x01');
      pcVar2 = pcVar1;
    }
    errCode = rtreeCheckTable(ctx->pOut->db,pcVar2,zTab,&local_30);
    pcVar1 = local_30;
    if (errCode == 0) {
      pcVar2 = "ok";
      if (local_30 != (char *)0x0) {
        pcVar2 = local_30;
      }
      setResultStrOrError(ctx,pcVar2,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_error_code(ctx,errCode);
      pcVar1 = local_30;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      sqlite3_free(pcVar1);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void rtreecheck(
  sqlite3_context *ctx,
  int nArg,
  sqlite3_value **apArg
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(ctx,
        "wrong number of arguments to function rtreecheck()", -1
    );
  }else{
    int rc;
    char *zReport = 0;
    const char *zDb = (const char*)sqlite3_value_text(apArg[0]);
    const char *zTab;
    if( nArg==1 ){
      zTab = zDb;
      zDb = "main";
    }else{
      zTab = (const char*)sqlite3_value_text(apArg[1]);
    }
    rc = rtreeCheckTable(sqlite3_context_db_handle(ctx), zDb, zTab, &zReport);
    if( rc==SQLITE_OK ){
      sqlite3_result_text(ctx, zReport ? zReport : "ok", -1, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_error_code(ctx, rc);
    }
    sqlite3_free(zReport);
  }
}